

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::TagAlias::~TagAlias(TagAlias *this)

{
  std::__cxx11::string::~string((string *)&this->lineInfo);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}